

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O0

void __thiscall Pl_DCT::~Pl_DCT(Pl_DCT *this)

{
  Pl_DCT *this_local;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_DCT_0058b270;
  std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::~unique_ptr(&this->m);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

Pl_DCT::~Pl_DCT() = default;